

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O0

int __thiscall crnlib::cfile_stream::open(cfile_stream *this,char *__file,int __oflag,...)

{
  uint64 uVar1;
  attribs_t in_CX;
  byte in_R8B;
  bool has_ownership_local;
  uint attribs_local;
  char *pFilename_local;
  FILE *pFile_local;
  cfile_stream *this_local;
  
  (*(this->super_data_stream)._vptr_data_stream[3])();
  data_stream::set_name(&this->super_data_stream,___oflag);
  this->m_pFile = (FILE *)__file;
  this->m_has_ownership = (bool)(in_R8B & 1);
  (this->super_data_stream).m_attribs = in_CX;
  uVar1 = ftello64((FILE *)this->m_pFile);
  this->m_ofs = uVar1;
  fseeko64((FILE *)this->m_pFile,0,2);
  uVar1 = ftello64((FILE *)this->m_pFile);
  this->m_size = uVar1;
  fseeko64((FILE *)this->m_pFile,this->m_ofs,0);
  (this->super_data_stream).field_0x1a = (this->super_data_stream).field_0x1a & 0xfe | 1;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool open(FILE* pFile, const char* pFilename, uint attribs, bool has_ownership)
        {
            CRNLIB_ASSERT(pFile);
            CRNLIB_ASSERT(pFilename);

            close();

            set_name(pFilename);
            m_pFile = pFile;
            m_has_ownership = has_ownership;
            m_attribs = static_cast<uint16>(attribs);

            m_ofs = crn_ftell(m_pFile);
            crn_fseek(m_pFile, 0, SEEK_END);
            m_size = crn_ftell(m_pFile);
            crn_fseek(m_pFile, m_ofs, SEEK_SET);

            m_opened = true;

            return true;
        }